

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1.c
# Opt level: O0

size_t ptls_asn1_get_expected_type_and_length
                 (uint8_t *bytes,size_t bytes_max,size_t byte_index,uint8_t expected_type,
                 uint32_t *length,int *indefinite_length,size_t *last_byte,int *decode_error,
                 ptls_minicrypto_log_ctx_t *log_ctx)

{
  int local_3c;
  int *piStack_38;
  int is_indefinite;
  int *indefinite_length_local;
  uint32_t *length_local;
  size_t sStack_20;
  uint8_t expected_type_local;
  size_t byte_index_local;
  size_t bytes_max_local;
  uint8_t *bytes_local;
  
  local_3c = 0;
  piStack_38 = indefinite_length;
  indefinite_length_local = (int *)length;
  length_local._7_1_ = expected_type;
  byte_index_local = bytes_max;
  bytes_max_local = (size_t)bytes;
  if (bytes[byte_index] == expected_type) {
    sStack_20 = byte_index + 1;
    sStack_20 = ptls_asn1_read_length
                          (bytes,bytes_max,sStack_20,length,&local_3c,last_byte,decode_error,0,
                           log_ctx);
    if (piStack_38 == (int *)0x0) {
      if (local_3c != 0) {
        sStack_20 = ptls_asn1_error_message
                              ("Incorrect length for DER",byte_index_local,sStack_20,0,log_ctx);
        *decode_error = 0x23a;
      }
    }
    else {
      *piStack_38 = local_3c;
    }
  }
  else {
    sStack_20 = byte_index;
    sStack_20 = ptls_asn1_error_message("Unexpected type",bytes_max,byte_index,0,log_ctx);
    *decode_error = 0x23b;
  }
  return sStack_20;
}

Assistant:

size_t ptls_asn1_get_expected_type_and_length(const uint8_t *bytes, size_t bytes_max, size_t byte_index, uint8_t expected_type,
                                              uint32_t *length, int *indefinite_length, size_t *last_byte, int *decode_error,
                                              ptls_minicrypto_log_ctx_t *log_ctx)
{
    int is_indefinite = 0;

    /* Check that the expected type is present */
    if (bytes[byte_index] != expected_type) {
        byte_index = ptls_asn1_error_message("Unexpected type", bytes_max, byte_index, 0, log_ctx);
        *decode_error = PTLS_ERROR_INCORRECT_ASN1_SYNTAX;
    } else {
        /* get length of element */
        byte_index++;
        byte_index =
            ptls_asn1_read_length(bytes, bytes_max, byte_index, length, &is_indefinite, last_byte, decode_error, 0, log_ctx);

        if (indefinite_length != NULL) {
            *indefinite_length = is_indefinite;
        } else if (is_indefinite) {
            byte_index = ptls_asn1_error_message("Incorrect length for DER", bytes_max, byte_index, 0, log_ctx);
            *decode_error = PTLS_ERROR_DER_INDEFINITE_LENGTH;
        }
    }

    return byte_index;
}